

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void perfetto::internal::TrackRegistry::InitializeInstance(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  TrackRegistry *this;
  long lVar4;
  pointer pcVar5;
  ulong uVar6;
  Uuid UVar7;
  string stat;
  StringSplitter splitter;
  char *endptr;
  string local_b8;
  StringSplitter local_98;
  char *local_50;
  string local_48;
  
  if (instance_ == (TrackRegistry *)0x0) {
    this = (TrackRegistry *)operator_new(0x58);
    TrackRegistry(this);
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_98.str_.field_2;
    local_98.str_.field_2._M_allocated_capacity._0_7_ = 0x732f636f72702f;
    local_98.str_.field_2._M_local_buf[7] = 'e';
    local_98.str_.field_2._8_7_ = 0x746174732f666c;
    local_98.str_._M_string_length = 0xf;
    local_98.str_.field_2._M_local_buf[0xf] = '\0';
    instance_ = this;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_98.str_._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = base::ReadFile(&local_98.str_,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.str_._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.str_._M_dataplus._M_p,
                      CONCAT17(local_98.str_.field_2._M_local_buf[7],
                               local_98.str_.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((bVar2) &&
       (lVar4 = ::std::__cxx11::string::rfind((char *)&local_b8,0x336d41,0xffffffffffffffff),
       lVar4 != -1)) {
      ::std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
      ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.str_._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.str_._M_dataplus._M_p,
                        CONCAT17(local_98.str_.field_2._M_local_buf[7],
                                 local_98.str_.field_2._M_allocated_capacity._0_7_) + 1);
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      base::StringSplitter::StringSplitter(&local_98,&local_48,' ');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      lVar4 = 0x14;
      pcVar5 = (pointer)0x0;
      do {
        bVar2 = base::StringSplitter::Next(&local_98);
        if (!bVar2) goto LAB_002ab180;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      local_50 = (char *)0x0;
      pcVar5 = (pointer)strtoull(local_98.cur_,&local_50,10);
      if ((*local_98.cur_ == '\0') || (*local_50 != '\0')) {
        pcVar5 = (pointer)0x0;
      }
LAB_002ab180:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.str_._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.str_._M_dataplus._M_p,
                        CONCAT17(local_98.str_.field_2._M_local_buf[7],
                                 local_98.str_.field_2._M_allocated_capacity._0_7_) + 1);
      }
    }
    else {
      pcVar5 = (pointer)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar5 == (pointer)0x0) {
      UVar7 = base::Uuidv4();
      Track::process_uuid = UVar7.data_._M_elems._0_8_;
    }
    else {
      local_98.str_._M_dataplus._M_p = pcVar5;
      uVar6 = 0xcbf29ce484222325;
      lVar4 = 0;
      do {
        uVar6 = (uVar6 ^ *(byte *)((long)&local_98.str_._M_dataplus._M_p + lVar4)) * 0x100000001b3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      iVar3 = Platform::process_id_;
      if (Platform::process_id_ == 0) {
        iVar3 = getpid();
      }
      local_98.str_._M_dataplus._M_p._0_4_ = iVar3;
      lVar4 = 0;
      do {
        uVar6 = (uVar6 ^ *(byte *)((long)&local_98.str_._M_dataplus._M_p + lVar4)) * 0x100000001b3;
        lVar4 = lVar4 + 1;
        Track::process_uuid = uVar6;
      } while (lVar4 != 4);
    }
  }
  return;
}

Assistant:

void TrackRegistry::InitializeInstance() {
  // TODO(eseckler): Chrome may call this more than once. Once Chrome doesn't
  // call this directly anymore, bring back DCHECK(!instance_) instead.
  if (instance_)
    return;
  instance_ = new TrackRegistry();

  // Use the process start time + pid as the unique identifier for this process.
  // This ensures that if there are two independent copies of the Perfetto SDK
  // in the same process (e.g., one in the app and another in a system
  // framework), events emitted by each will be consistently interleaved on
  // common thread and process tracks.
  if (uint64_t start_time = GetProcessStartTime()) {
    base::Hash hash;
    hash.Update(start_time);
    hash.Update(Platform::GetCurrentProcessId());
    Track::process_uuid = hash.digest();
  } else {
    // Fall back to a randomly generated identifier.
    Track::process_uuid = static_cast<uint64_t>(base::Uuidv4().lsb());
  }
}